

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs::operator_cast_to_result(result *__return_storage_ptr__,expression_lhs *this)

{
  lest local_88 [32];
  string local_68 [39];
  bool local_41;
  result local_40;
  expression_lhs *local_18;
  expression_lhs<const_nonstd::optional_lite::optional<(anonymous_namespace)::Explicit>_&>
  *this_local;
  
  local_18 = this;
  this_local = (expression_lhs<const_nonstd::optional_lite::optional<(anonymous_namespace)::Explicit>_&>
                *)__return_storage_ptr__;
  local_41 = nonstd::optional_lite::optional::operator_cast_to_bool(*(optional **)this);
  to_string<nonstd::optional_lite::optional<(anonymous_namespace)::Explicit>>
            (local_88,*(optional<(anonymous_namespace)::Explicit> **)this);
  std::__cxx11::string::string(local_68,(string *)local_88);
  result::result<bool>(&local_40,&local_41,(text *)local_68);
  result::result(__return_storage_ptr__,&local_40);
  result::~result(&local_40);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)local_88);
  return __return_storage_ptr__;
}

Assistant:

operator result() { return result( !!lhs, to_string( lhs ) ); }